

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_data.cpp
# Opt level: O3

Timestamp ot::commissioner::Timestamp::Cur(void)

{
  undefined1 auVar1 [16];
  long lVar2;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  auVar1 = SEXT816(((lVar2 / 1000) % 1000000) * 0x8000) * SEXT816(0x431bde82d7b634db);
  return (Timestamp)
         ((ulong)((int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f) & 0x7fff) << 0x30 |
         lVar2 / 1000000000 & 0xffffffffffffU);
}

Assistant:

Timestamp Timestamp::Cur()
{
    Timestamp cur;
    auto      now = NowSinceEpoch<std::chrono::microseconds>().count();
    cur.mSeconds  = now / 1000000;
    cur.mTicks    = (now % 1000000) * (1 << 15) / 1000000;

    // Not an authoritive source
    cur.mU = 0;

    return cur;
}